

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

Constraint * create_appropriate_equal_constraint_for(char *parameter_name,CgreenValue actual)

{
  Constraint *constraint;
  char *in_stack_00000018;
  undefined8 local_10;
  
  if ((int)constraint == 2) {
    local_10 = create_equal_to_double_constraint((double)actual._0_8_,in_stack_00000018);
  }
  else {
    local_10 = create_equal_to_value_constraint(actual._0_8_,in_stack_00000018);
  }
  return local_10;
}

Assistant:

static Constraint *create_appropriate_equal_constraint_for(const char *parameter_name,
                                                           CgreenValue actual) {
    Constraint *constraint;
    if (actual.type == CGREEN_DOUBLE)
        constraint = create_equal_to_double_constraint(actual.value.double_value,
                                                       parameter_name);
    else
        constraint = create_equal_to_value_constraint(actual.value.integer_value,
                                                      parameter_name);
    return constraint;
}